

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

void convertToLevelAndOption(SocketOption opt,NetworkLayerProtocol socketProtocol,int *level,int *n)

{
  int iVar1;
  
  *n = -1;
  *level = 1;
  iVar1 = 6;
  switch(opt) {
  case BroadcastSocketOption:
    break;
  case ReceiveBufferSocketOption:
switchD_0022ef6c_caseD_2:
    iVar1 = 8;
    break;
  case SendBufferSocketOption:
    iVar1 = 7;
    break;
  case AddressReusable:
    iVar1 = 2;
    break;
  default:
    goto switchD_0022ef6c_caseD_5;
  case ReceiveOutOfBandData:
    iVar1 = 10;
    break;
  case LowDelayOption:
    *level = 6;
    goto LAB_0022f017;
  case KeepAliveOption:
    iVar1 = 9;
    break;
  case MulticastTtlOption:
    if ((uint)(socketProtocol + UnknownNetworkLayerProtocol) < 2) {
      *level = 0x29;
      iVar1 = 0x12;
    }
    else {
      *level = 0;
      iVar1 = 0x21;
    }
    break;
  case MulticastLoopbackOption:
    if ((uint)(socketProtocol + UnknownNetworkLayerProtocol) < 2) {
      *level = 0x29;
      iVar1 = 0x13;
    }
    else {
      *level = 0;
      iVar1 = 0x22;
    }
    break;
  case TypeOfServiceOption:
    if (socketProtocol != IPv4Protocol) {
      return;
    }
    *level = 0;
LAB_0022f017:
    iVar1 = 1;
    break;
  case ReceivePacketInformation:
    if (1 < (uint)(socketProtocol + UnknownNetworkLayerProtocol)) {
      if (socketProtocol != IPv4Protocol) {
        return;
      }
      *level = 0;
      goto switchD_0022ef6c_caseD_2;
    }
    *level = 0x29;
    iVar1 = 0x31;
    break;
  case ReceiveHopLimit:
    if ((uint)(socketProtocol + UnknownNetworkLayerProtocol) < 2) {
      *level = 0x29;
      iVar1 = 0x33;
    }
    else {
      if (socketProtocol != IPv4Protocol) {
        return;
      }
      *level = 0;
      iVar1 = 0xc;
    }
    break;
  case PathMtuInformation:
    if ((uint)(socketProtocol + UnknownNetworkLayerProtocol) < 2) {
      *level = 0x29;
      iVar1 = 0x18;
    }
    else {
      *level = 0;
      iVar1 = 0xe;
    }
  }
  *n = iVar1;
switchD_0022ef6c_caseD_5:
  return;
}

Assistant:

static void convertToLevelAndOption(QNativeSocketEngine::SocketOption opt,
                                    QAbstractSocket::NetworkLayerProtocol socketProtocol, int &level, int &n)
{
    n = -1;
    level = SOL_SOCKET; // default

    switch (opt) {
    case QNativeSocketEngine::NonBlockingSocketOption:  // fcntl, not setsockopt
    case QNativeSocketEngine::BindExclusively:          // not handled on Unix
    case QNativeSocketEngine::MaxStreamsSocketOption:
        Q_UNREACHABLE();

    case QNativeSocketEngine::BroadcastSocketOption:
        n = SO_BROADCAST;
        break;
    case QNativeSocketEngine::ReceiveBufferSocketOption:
        n = SO_RCVBUF;
        break;
    case QNativeSocketEngine::SendBufferSocketOption:
        n = SO_SNDBUF;
        break;
    case QNativeSocketEngine::AddressReusable:
        n = SO_REUSEADDR;
        break;
    case QNativeSocketEngine::ReceiveOutOfBandData:
        n = SO_OOBINLINE;
        break;
    case QNativeSocketEngine::LowDelayOption:
        level = IPPROTO_TCP;
        n = TCP_NODELAY;
        break;
    case QNativeSocketEngine::KeepAliveOption:
        n = SO_KEEPALIVE;
        break;
    case QNativeSocketEngine::MulticastTtlOption:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_MULTICAST_HOPS;
        } else
        {
            level = IPPROTO_IP;
            n = IP_MULTICAST_TTL;
        }
        break;
    case QNativeSocketEngine::MulticastLoopbackOption:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_MULTICAST_LOOP;
        } else
        {
            level = IPPROTO_IP;
            n = IP_MULTICAST_LOOP;
        }
        break;
    case QNativeSocketEngine::TypeOfServiceOption:
        if (socketProtocol == QAbstractSocket::IPv4Protocol) {
            level = IPPROTO_IP;
            n = IP_TOS;
        }
        break;
    case QNativeSocketEngine::ReceivePacketInformation:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_RECVPKTINFO;
        } else if (socketProtocol == QAbstractSocket::IPv4Protocol) {
            level = IPPROTO_IP;
#ifdef IP_PKTINFO
            n = IP_PKTINFO;
#elif defined(IP_RECVDSTADDR)
            // variant found in QNX and FreeBSD; it will get us only the
            // destination address, not the interface; we need IP_RECVIF for that.
            n = IP_RECVDSTADDR;
#endif
        }
        break;
    case QNativeSocketEngine::ReceiveHopLimit:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_RECVHOPLIMIT;
        } else if (socketProtocol == QAbstractSocket::IPv4Protocol) {
#ifdef IP_RECVTTL               // IP_RECVTTL is a non-standard extension supported on some OS
            level = IPPROTO_IP;
            n = IP_RECVTTL;
#endif
        }
        break;

    case QNativeSocketEngine::PathMtuInformation:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
#ifdef IPV6_MTU
            level = IPPROTO_IPV6;
            n = IPV6_MTU;
#endif
        } else {
#ifdef IP_MTU
            level = IPPROTO_IP;
            n = IP_MTU;
#endif
        }
        break;
    }
}